

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexSeparableKernel::splitL(PtexSeparableKernel *this,PtexSeparableKernel *k)

{
  Res RVar1;
  int iVar2;
  int iVar3;
  float *__src;
  float *__src_00;
  int iVar4;
  
  iVar2 = this->u;
  if (-iVar2 < this->uw) {
    RVar1 = this->res;
    iVar4 = this->v;
    iVar3 = this->vw;
    __src = this->ku;
    __src_00 = this->kv;
    k->res = RVar1;
    k->u = (1 << (RVar1.ulog2 & 0x1fU)) + iVar2;
    k->v = iVar4;
    k->uw = -iVar2;
    k->vw = iVar3;
    memcpy(k->kubuff,__src,(long)iVar2 * -4);
    memcpy(k->kvbuff,__src_00,(long)iVar3 << 2);
    k->ku = k->kubuff;
    k->kv = k->kvbuff;
    k->rot = 0;
    iVar4 = iVar2 + this->uw;
    this->ku = this->ku + -(long)iVar2;
  }
  else {
    operator=(k,this);
    k->u = k->u + (1 << ((this->res).ulog2 & 0x1fU));
    iVar4 = 0;
  }
  this->u = 0;
  this->uw = iVar4;
  return;
}

Assistant:

void splitL(PtexSeparableKernel& k)
    {
        // split off left piece of width w into k
        int w = -u;

        if (w < uw) {
            // normal case - split off a portion
            //    res  u          v  uw vw  ku  kv
            k.set(res, res.u()-w, v, w, vw, ku, kv);

            // update local
            u = 0;
            uw -= w;
            ku += w;
        }
        else {
            // entire kernel is split off
            k = *this;
            k.u += res.u();
            u = 0; uw = 0;
        }
    }